

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O1

void * sigvcf_new(t_floatarg q)

{
  t_object *owner;
  t_symbol *ptVar1;
  t_symbol *s2;
  
  owner = (t_object *)pd_new(sigvcf_class);
  inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  ptVar1 = gensym("float");
  s2 = gensym("ft1");
  inlet_new(owner,(t_pd *)owner,ptVar1,s2);
  ptVar1 = gensym("signal");
  outlet_new(owner,ptVar1);
  ptVar1 = gensym("signal");
  outlet_new(owner,ptVar1);
  owner[1].te_g.g_pd = (t_pd)0x0;
  *(t_floatarg *)&owner[1].te_g.g_next = q;
  *(undefined8 *)((long)&owner[1].te_g.g_next + 4) = 0;
  return owner;
}

Assistant:

static void *sigvcf_new(t_floatarg q)
{
    t_sigvcf *x = (t_sigvcf *)pd_new(sigvcf_class);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("float"), gensym("ft1"));
    outlet_new(&x->x_obj, gensym("signal"));
    outlet_new(&x->x_obj, gensym("signal"));
    x->x_cspace.c_re = 0;
    x->x_cspace.c_im = 0;
    x->x_cspace.c_q = q;
    x->x_cspace.c_isr = 0;
    x->x_f = 0;
    return (x);
}